

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O0

void Abc_IsopTestNew(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  word wVar4;
  int *pCover;
  word Cost;
  word copy;
  word t;
  word r;
  Vec_Int_t *vCover;
  int nVars;
  
  vCover._4_4_ = 4;
  r = (word)Vec_IntAlloc(1000);
  iVar1 = vCover._4_4_;
  Cost = s_Truths6[0] & s_Truths6[1] ^ s_Truths6[2] & s_Truths6[3];
  copy = Cost;
  wVar4 = Abc_Cube2Cost(0xffff);
  pCover = Vec_IntArray((Vec_Int_t *)r);
  wVar4 = Abc_EsopCheck(&copy,iVar1,wVar4,pCover);
  iVar1 = Abc_CostCubes(wVar4);
  *(int *)(r + 4) = iVar1;
  if (*(int *)(r + 4) <= *(int *)r) {
    uVar2 = Abc_CostCubes(wVar4);
    uVar3 = Abc_CostLits(wVar4);
    printf("Cubes = %d.  Lits = %d.\n",(ulong)uVar2,(ulong)uVar3);
    Abc_IsopPrintCover((Vec_Int_t *)r,vCover._4_4_,0);
    Abc_IsopVerify(&Cost,vCover._4_4_,&t,(Vec_Int_t *)r,1,0);
    Vec_IntFree((Vec_Int_t *)r);
    return;
  }
  __assert_fail("vCover->nSize <= vCover->nCap",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                ,0x3ec,"void Abc_IsopTestNew()");
}

Assistant:

void Abc_IsopTestNew()
{
    int nVars = 4;
    Vec_Int_t * vCover = Vec_IntAlloc( 1000 );
    word r, t = (s_Truths6[0] & s_Truths6[1]) ^ (s_Truths6[2] & s_Truths6[3]), copy = t;
//    word r, t = ~s_Truths6[0] | (s_Truths6[1] & s_Truths6[2] & s_Truths6[3]), copy = t;
//    word r, t = 0xABCDABCDABCDABCD, copy = t;
//    word r, t = 0x6996000000006996, copy = t;
//    word Cost = Abc_IsopNew( &t, &t, &r, nVars, Abc_Cube2Cost(ABC_ISOP_MAX_CUBE), Vec_IntArray(vCover) );
    word Cost = Abc_EsopCheck( &t, nVars, Abc_Cube2Cost(ABC_ISOP_MAX_CUBE), Vec_IntArray(vCover) );
    vCover->nSize = Abc_CostCubes(Cost);
    assert( vCover->nSize <= vCover->nCap );
    printf( "Cubes = %d.  Lits = %d.\n", Abc_CostCubes(Cost), Abc_CostLits(Cost) );
    Abc_IsopPrintCover( vCover, nVars, 0 );
    Abc_IsopVerify( &copy, nVars, &r, vCover, 1, 0 );
    Vec_IntFree( vCover );
}